

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckFailsOnException::~TestCheckFailsOnException
          (TestCheckFailsOnException *this)

{
  TestCheckFailsOnException *this_local;
  
  ~TestCheckFailsOnException(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckFailsOnException)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK(ThrowingFunction() == 1);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}